

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

bool tinyusdz::value::IsRoleType(uint32_t tyid)

{
  uint32_t uVar1;
  uint32_t in_EDX;
  string local_30;
  uint32_t local_c;
  uint32_t tyid_local;
  
  local_c = tyid;
  GetTypeName_abi_cxx11_(&local_30,(value *)(ulong)tyid,in_EDX);
  uVar1 = GetUnderlyingTypeId(&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return uVar1 != 0;
}

Assistant:

bool IsRoleType(const uint32_t tyid) {
  return GetUnderlyingTypeId(GetTypeName(tyid)) != value::TYPE_ID_INVALID;
}